

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Map_Time_t * Abc_NtkMapCopyCoRequiredCon(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Map_Time_t *pMVar2;
  float fVar3;
  int local_1c;
  int i;
  Map_Time_t *p;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCoNum(pNtk);
  pMVar2 = (Map_Time_t *)calloc((long)iVar1,0xc);
  local_1c = 0;
  while( true ) {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_1c) break;
    iVar1 = Scl_ConGetOutReq(local_1c);
    fVar3 = Scl_Int2Flt(iVar1);
    pMVar2[local_1c].Worst = fVar3;
    pMVar2[local_1c].Rise = fVar3;
    pMVar2[local_1c].Fall = fVar3;
    local_1c = local_1c + 1;
  }
  return pMVar2;
}

Assistant:

Map_Time_t * Abc_NtkMapCopyCoRequiredCon( Abc_Ntk_t * pNtk )
{
    Map_Time_t * p; int i;
    p = ABC_CALLOC( Map_Time_t, Abc_NtkCoNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
        p[i].Fall = p[i].Rise = p[i].Worst = Scl_Int2Flt( Scl_ConGetOutReq(i) );
    return p;
}